

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl.cpp
# Opt level: O0

bool libtorrent::aux::ssl::has_context(stream_handle_type s,context_handle_type c)

{
  context_handle_type pSVar1;
  context_handle_type stream_ctx;
  context_handle_type c_local;
  stream_handle_type s_local;
  
  pSVar1 = get_context(s);
  return pSVar1 == c;
}

Assistant:

bool has_context(stream_handle_type s, context_handle_type c)
{
	context_handle_type stream_ctx = get_context(s);
#if defined TORRENT_USE_OPENSSL
	return stream_ctx == c;
#elif defined TORRENT_USE_GNUTLS
	return stream_ctx->native_handle() == c->native_handle();
#endif
}